

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsWindowsPELinker.cxx
# Opt level: O3

bool __thiscall cmBinUtilsWindowsPELinker::Prepare(cmBinUtilsWindowsPELinker *this)

{
  pointer pcVar1;
  cmRuntimeDependencyArchive *this_00;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *pcVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  cmBinUtilsWindowsPEGetRuntimeDependenciesTool *this_01;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string tool;
  ostringstream e;
  undefined1 local_1e8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  psVar6 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesTool_abi_cxx11_
                     ((this->super_cmBinUtilsLinker).Archive);
  pcVar1 = (psVar6->_M_dataplus)._M_p;
  local_1c8._M_allocated_capacity = (size_type)local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c8,pcVar1,pcVar1 + psVar6->_M_string_length);
  if ((char *)local_1c8._8_8_ == (char *)0x0) {
    local_1e8._0_8_ = (pointer)0x0;
    local_1e8._8_8_ = (pointer)0x0;
    local_1e8._16_8_ = (pointer)0x0;
    this_00 = (this->super_cmBinUtilsLinker).Archive;
    local_1a8._0_8_ = local_1a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"dumpbin","");
    bVar4 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                      (this_00,(string *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_1e8);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    pcVar3 = "Could not find objdump";
    if (bVar4) {
      pcVar3 = "Could not find dumpbin";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&local_1c8,0,(char *)local_1c8._8_8_,(ulong)(pcVar3 + 0xf));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1e8);
  }
  iVar5 = std::__cxx11::string::compare(local_1c8._M_local_buf);
  if (iVar5 == 0) {
    this_01 = (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)operator_new(0x10);
    cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool::
    cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool
              ((cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool *)this_01,
               (this->super_cmBinUtilsLinker).Archive);
  }
  else {
    iVar5 = std::__cxx11::string::compare(local_1c8._M_local_buf);
    if (iVar5 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: ",0x37
                );
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)local_1c8._M_allocated_capacity,local_1c8._8_8_);
      std::__cxx11::stringbuf::str();
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,(string *)local_1e8);
      if ((pointer)local_1e8._0_8_ != (pointer)(local_1e8 + 0x10)) {
        operator_delete((void *)local_1e8._0_8_,(ulong)(local_1e8._16_8_ + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      bVar4 = false;
      goto LAB_004d35dc;
    }
    this_01 = (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)operator_new(0x10);
    cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool::
    cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool
              ((cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool *)this_01,
               (this->super_cmBinUtilsLinker).Archive);
  }
  pcVar2 = (this->Tool)._M_t.
           super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
           ._M_t.
           super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
           .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>.
           _M_head_impl;
  (this->Tool)._M_t.
  super___uniq_ptr_impl<cmBinUtilsWindowsPEGetRuntimeDependenciesTool,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
  ._M_t.
  super__Tuple_impl<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_std::default_delete<cmBinUtilsWindowsPEGetRuntimeDependenciesTool>_>
  .super__Head_base<0UL,_cmBinUtilsWindowsPEGetRuntimeDependenciesTool_*,_false>._M_head_impl =
       this_01;
  bVar4 = true;
  if (pcVar2 != (cmBinUtilsWindowsPEGetRuntimeDependenciesTool *)0x0) {
    (*pcVar2->_vptr_cmBinUtilsWindowsPEGetRuntimeDependenciesTool[1])();
  }
LAB_004d35dc:
  if ((long *)local_1c8._M_allocated_capacity != local_1b8) {
    operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8[0] + 1);
  }
  return bVar4;
}

Assistant:

bool cmBinUtilsWindowsPELinker::Prepare()
{
  std::string tool = this->Archive->GetGetRuntimeDependenciesTool();
  if (tool.empty()) {
    std::vector<std::string> command;
    if (this->Archive->GetGetRuntimeDependenciesCommand("dumpbin", command)) {
      tool = "dumpbin";
    } else {
      tool = "objdump";
    }
  }
  if (tool == "dumpbin") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEDumpbinGetRuntimeDependenciesTool>(
        this->Archive);
  } else if (tool == "objdump") {
    this->Tool =
      cm::make_unique<cmBinUtilsWindowsPEObjdumpGetRuntimeDependenciesTool>(
        this->Archive);
  } else {
    std::ostringstream e;
    e << "Invalid value for CMAKE_GET_RUNTIME_DEPENDENCIES_TOOL: " << tool;
    this->SetError(e.str());
    return false;
  }

  return true;
}